

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxBoxDetector.cpp
# Opt level: O3

void cullPoints2(int n,cbtScalar *p,int m,int i0,int *iret)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  undefined1 auVar10 [60];
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ushort uVar16;
  undefined1 auVar17 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_register_000014c4 [12];
  int avail [8];
  cbtScalar A [8];
  float local_98;
  float local_88;
  int aiStack_78 [8];
  float afStack_58 [10];
  
  if (n == 1) {
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)p;
  }
  else if (n == 2) {
    auVar27._0_4_ = (float)*(undefined8 *)p + (float)*(undefined8 *)(p + 2);
    auVar27._4_4_ =
         (float)((ulong)*(undefined8 *)p >> 0x20) + (float)((ulong)*(undefined8 *)(p + 2) >> 0x20);
    auVar27._8_8_ = 0;
    auVar7._8_4_ = 0x3f000000;
    auVar7._0_8_ = 0x3f0000003f000000;
    auVar7._12_4_ = 0x3f000000;
    auVar17 = vmulps_avx512vl(auVar27,auVar7);
  }
  else {
    if (n < 2) {
      auVar17 = SUB6416(ZEXT864(0),0);
      fVar26 = 0.0;
    }
    else {
      auVar19 = ZEXT864(0);
      fVar26 = 0.0;
      uVar15 = 0;
      do {
        uVar1 = *(ulong *)(p + uVar15 * 2);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar1;
        uVar2 = *(ulong *)(p + uVar15 * 2 + 2);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uVar2;
        uVar15 = uVar15 + 1;
        auVar17 = vmovshdup_avx(auVar28);
        auVar18 = vmovshdup_avx(auVar31);
        auVar17 = vfmsub213ss_fma(auVar18,auVar28,ZEXT416((uint)(auVar17._0_4_ * (float)uVar2)));
        auVar18._0_4_ = (float)uVar1 + (float)uVar2;
        auVar18._4_4_ = (float)(uVar1 >> 0x20) + (float)(uVar2 >> 0x20);
        auVar18._8_8_ = 0;
        fVar35 = auVar17._0_4_;
        auVar32._4_4_ = fVar35;
        auVar32._0_4_ = fVar35;
        auVar32._8_4_ = fVar35;
        auVar32._12_4_ = fVar35;
        fVar26 = fVar26 + fVar35;
        auVar17 = vfmadd231ps_fma(auVar19._0_16_,auVar18,auVar32);
        auVar19 = ZEXT1664(auVar17);
      } while (n - 1 != uVar15);
    }
    if (n < 1) {
      bVar3 = false;
      goto LAB_008c32c6;
    }
    uVar15 = *(ulong *)p;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar15;
    uVar1 = *(ulong *)(p + (long)(n * 2) + -2);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar1;
    auVar18 = vmovshdup_avx(auVar29);
    auVar28 = vmovshdup_avx(auVar33);
    auVar18 = vfmsub213ss_fma(auVar18,auVar33,ZEXT416((uint)(auVar28._0_4_ * (float)uVar15)));
    auVar34._0_4_ = (float)uVar1 + (float)uVar15;
    auVar34._4_4_ = (float)(uVar1 >> 0x20) + (float)(uVar15 >> 0x20);
    auVar34._8_8_ = 0;
    fVar35 = auVar18._0_4_;
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar18 = vandps_avx512vl(ZEXT416((uint)(fVar26 + fVar35)),auVar8);
    auVar30._4_4_ = fVar35;
    auVar30._0_4_ = fVar35;
    auVar30._8_4_ = fVar35;
    auVar30._12_4_ = fVar35;
    uVar5 = vcmpss_avx512f(auVar18,ZEXT416(0x34000000),0xe);
    bVar3 = (bool)((byte)uVar5 & 1);
    auVar18 = vfmadd213ps_fma(auVar30,auVar34,auVar17);
    fVar26 = (float)((uint)bVar3 * (int)(1.0 / ((fVar26 + fVar35) * 3.0)) +
                    (uint)!bVar3 * 0x5d5e0b6b);
    auVar17._0_4_ = auVar18._0_4_ * fVar26;
    auVar17._4_4_ = auVar18._4_4_ * fVar26;
    auVar17._8_4_ = auVar18._8_4_ * fVar26;
    auVar17._12_4_ = auVar18._12_4_ * fVar26;
  }
  uVar15 = 0;
  auVar18 = vmovshdup_avx(auVar17);
  do {
    local_88 = auVar18._0_4_;
    local_98 = auVar17._0_4_;
    fVar26 = atan2f(p[uVar15 * 2 + 1] - local_88,p[uVar15 * 2] - local_98);
    afStack_58[uVar15] = fVar26;
    uVar15 = uVar15 + 1;
  } while ((uint)n != uVar15);
  auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar21 = vpbroadcastd_avx512f(ZEXT416(1));
  auVar22 = vpbroadcastq_avx512f();
  uVar15 = 0;
  do {
    auVar23 = vpbroadcastq_avx512f();
    auVar24 = vporq_avx512f(auVar23,auVar19);
    auVar25 = vporq_avx512f(auVar23,auVar20);
    uVar5 = vpcmpuq_avx512f(auVar25,auVar22,2);
    uVar6 = vpcmpuq_avx512f(auVar24,auVar22,2);
    bVar9 = (byte)uVar6;
    uVar16 = CONCAT11(bVar9,(char)uVar5);
    bVar3 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar10._4_56_ = auVar25._8_56_;
    auVar10._0_4_ = (uint)bVar3 * auVar25._4_4_ | (uint)!bVar3 * auVar23._4_4_;
    in_ZmmResult._0_8_ = auVar10._0_8_ << 0x20;
    bVar3 = (bool)((byte)(uVar16 >> 2) & 1);
    in_ZmmResult._8_4_ = (uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * auVar23._8_4_;
    bVar3 = (bool)((byte)(uVar16 >> 3) & 1);
    in_ZmmResult._12_4_ = (uint)bVar3 * auVar25._12_4_ | (uint)!bVar3 * auVar23._12_4_;
    bVar3 = (bool)((byte)(uVar16 >> 4) & 1);
    in_ZmmResult._16_4_ = (uint)bVar3 * auVar25._16_4_ | (uint)!bVar3 * auVar23._16_4_;
    bVar3 = (bool)((byte)(uVar16 >> 5) & 1);
    in_ZmmResult._20_4_ = (uint)bVar3 * auVar25._20_4_ | (uint)!bVar3 * auVar23._20_4_;
    bVar3 = (bool)((byte)(uVar16 >> 6) & 1);
    in_ZmmResult._24_4_ = (uint)bVar3 * auVar25._24_4_ | (uint)!bVar3 * auVar23._24_4_;
    bVar3 = (bool)((byte)(uVar16 >> 7) & 1);
    in_ZmmResult._28_4_ = (uint)bVar3 * auVar25._28_4_ | (uint)!bVar3 * auVar23._28_4_;
    in_ZmmResult._32_4_ =
         (uint)(bVar9 & 1) * auVar25._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar23._32_4_;
    bVar3 = (bool)(bVar9 >> 1 & 1);
    in_ZmmResult._36_4_ = (uint)bVar3 * auVar25._36_4_ | (uint)!bVar3 * auVar23._36_4_;
    bVar3 = (bool)(bVar9 >> 2 & 1);
    in_ZmmResult._40_4_ = (uint)bVar3 * auVar25._40_4_ | (uint)!bVar3 * auVar23._40_4_;
    bVar3 = (bool)(bVar9 >> 3 & 1);
    in_ZmmResult._44_4_ = (uint)bVar3 * auVar25._44_4_ | (uint)!bVar3 * auVar23._44_4_;
    bVar3 = (bool)(bVar9 >> 4 & 1);
    in_ZmmResult._48_4_ = (uint)bVar3 * auVar25._48_4_ | (uint)!bVar3 * auVar23._48_4_;
    bVar3 = (bool)(bVar9 >> 5 & 1);
    in_ZmmResult._52_4_ = (uint)bVar3 * auVar25._52_4_ | (uint)!bVar3 * auVar23._52_4_;
    bVar3 = (bool)(bVar9 >> 6 & 1);
    in_ZmmResult._56_4_ = (uint)bVar3 * auVar25._56_4_ | (uint)!bVar3 * auVar23._56_4_;
    in_ZmmResult._60_4_ =
         (uint)(bVar9 >> 7) * auVar25._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar23._60_4_;
    auVar23 = vmovdqu32_avx512f(auVar21);
    *(undefined1 (*) [64])(aiStack_78 + uVar15) = auVar23;
    uVar15 = uVar15 + 0x10;
  } while ((n + 0xfU & 0xfffffff0) != uVar15);
  bVar3 = true;
LAB_008c32c6:
  lVar11 = (long)i0;
  aiStack_78[lVar11] = 0;
  *iret = i0;
  if (1 < m) {
    fVar26 = afStack_58[lVar11];
    auVar36._8_4_ = 0x7fffffff;
    auVar36._0_8_ = 0x7fffffff7fffffff;
    auVar36._12_4_ = 0x7fffffff;
    iVar12 = 1;
    do {
      auVar37._0_4_ = (float)iVar12;
      auVar37._4_12_ = in_register_000014c4;
      iret[1] = i0;
      iret = iret + 1;
      auVar17 = vfmadd213ss_fma(auVar37,ZEXT416((uint)(6.2831855 / (float)m)),ZEXT416((uint)fVar26))
      ;
      uVar5 = vcmpss_avx512f(auVar17,SUB6416(ZEXT464(0x40490fdb),0),0xe);
      bVar4 = (bool)((byte)uVar5 & 1);
      lVar14 = lVar11;
      if (bVar3) {
        auVar20._16_48_ = in_ZmmResult._16_48_;
        auVar20._0_16_ = auVar17;
        auVar19._4_60_ = auVar20._4_60_;
        auVar19._0_4_ =
             (float)((uint)bVar4 * (int)(auVar17._0_4_ + -6.2831855) +
                    (uint)!bVar4 * (int)auVar17._0_4_);
        uVar15 = 0;
        auVar20 = ZEXT1664(SUB6416(ZEXT464(0x4e6e6b28),0));
        in_ZmmResult = auVar19;
        iVar13 = i0;
        do {
          if (aiStack_78[uVar15] != 0) {
            auVar17 = vandps_avx(ZEXT416((uint)(afStack_58[uVar15] - auVar19._0_4_)),auVar36);
            uVar5 = vcmpss_avx512f(auVar17,SUB6416(ZEXT464(0x40490fdb),0),0xe);
            bVar4 = (bool)((byte)uVar5 & 1);
            auVar21._16_48_ = in_ZmmResult._16_48_;
            auVar21._0_16_ = auVar17;
            in_ZmmResult._4_60_ = auVar21._4_60_;
            in_ZmmResult._0_4_ =
                 (float)((uint)bVar4 * (int)(6.2831855 - auVar17._0_4_) +
                        (uint)!bVar4 * (int)auVar17._0_4_);
            if (in_ZmmResult._0_4_ < auVar20._0_4_) {
              iVar13 = (int)uVar15;
              *iret = iVar13;
              auVar20 = ZEXT1664(in_ZmmResult._0_16_);
            }
          }
          uVar15 = uVar15 + 1;
        } while ((uint)n != uVar15);
        lVar14 = (long)iVar13;
      }
      iVar12 = iVar12 + 1;
      aiStack_78[lVar14] = 0;
    } while (iVar12 != m);
  }
  return;
}

Assistant:

void cullPoints2(int n, cbtScalar p[], int m, int i0, int iret[])
{
	// compute the centroid of the polygon in cx,cy
	int i, j;
	cbtScalar a, cx, cy, q;
	if (n == 1)
	{
		cx = p[0];
		cy = p[1];
	}
	else if (n == 2)
	{
		cx = cbtScalar(0.5) * (p[0] + p[2]);
		cy = cbtScalar(0.5) * (p[1] + p[3]);
	}
	else
	{
		a = 0;
		cx = 0;
		cy = 0;
		for (i = 0; i < (n - 1); i++)
		{
			q = p[i * 2] * p[i * 2 + 3] - p[i * 2 + 2] * p[i * 2 + 1];
			a += q;
			cx += q * (p[i * 2] + p[i * 2 + 2]);
			cy += q * (p[i * 2 + 1] + p[i * 2 + 3]);
		}
		q = p[n * 2 - 2] * p[1] - p[0] * p[n * 2 - 1];
		if (cbtFabs(a + q) > SIMD_EPSILON)
		{
			a = 1.f / (cbtScalar(3.0) * (a + q));
		}
		else
		{
			a = BT_LARGE_FLOAT;
		}
		cx = a * (cx + q * (p[n * 2 - 2] + p[0]));
		cy = a * (cy + q * (p[n * 2 - 1] + p[1]));
	}

	// compute the angle of each point w.r.t. the centroid
	cbtScalar A[8];
	for (i = 0; i < n; i++) A[i] = cbtAtan2(p[i * 2 + 1] - cy, p[i * 2] - cx);

	// search for points that have angles closest to A[i0] + i*(2*pi/m).
	int avail[8];
	for (i = 0; i < n; i++) avail[i] = 1;
	avail[i0] = 0;
	iret[0] = i0;
	iret++;
	for (j = 1; j < m; j++)
	{
		a = cbtScalar(j) * (2 * M__PI / m) + A[i0];
		if (a > M__PI) a -= 2 * M__PI;
		cbtScalar maxdiff = 1e9, diff;

		*iret = i0;  // iret is not allowed to keep this value, but it sometimes does, when diff=#QNAN0

		for (i = 0; i < n; i++)
		{
			if (avail[i])
			{
				diff = cbtFabs(A[i] - a);
				if (diff > M__PI) diff = 2 * M__PI - diff;
				if (diff < maxdiff)
				{
					maxdiff = diff;
					*iret = i;
				}
			}
		}
#if defined(DEBUG) || defined(_DEBUG)
		cbtAssert(*iret != i0);  // ensure iret got set
#endif
		avail[*iret] = 0;
		iret++;
	}
}